

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Evaluator.cpp
# Opt level: O2

Object * __thiscall
punky::eval::Evaluator::eval_program
          (Object *__return_storage_ptr__,Evaluator *this,Environment *env)

{
  _Head_base<0UL,_punky::ast::Program_*,_false> _Var1;
  pointer puVar2;
  variant_alternative_t<3UL,_variant<monostate,_int,_bool,_any,_basic_string<char>,_FunctionObject>_>
  *__any;
  pointer puVar3;
  Object local_90;
  Object local_60;
  
  local_90.m_type = Null;
  local_90.m_value.
  super__Variant_base<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
  .
  super__Move_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Copy_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Move_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Copy_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Variant_storage_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  ._M_index = '\0';
  local_90.m_value.
  super__Variant_base<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
  .
  super__Move_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Copy_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Move_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Copy_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Variant_storage_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  ._33_7_ = 0;
  local_90.m_value.
  super__Variant_base<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
  .
  super__Move_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Copy_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Move_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Copy_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Variant_storage_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  ._M_u._0_8_ = 0;
  local_90.m_value.
  super__Variant_base<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
  .
  super__Move_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Copy_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Move_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Copy_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Variant_storage_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  ._M_u._8_8_ = 0;
  local_90.m_value.
  super__Variant_base<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
  .
  super__Move_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Copy_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Move_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Copy_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Variant_storage_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  ._M_u._16_8_ = 0;
  local_90.m_value.
  super__Variant_base<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
  .
  super__Move_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Copy_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Move_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Copy_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  .
  super__Variant_storage_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
  ._M_u._24_8_ = 0;
  _Var1._M_head_impl =
       (this->m_program)._M_t.
       super___uniq_ptr_impl<punky::ast::Program,_std::default_delete<punky::ast::Program>_>._M_t.
       super__Tuple_impl<0UL,_punky::ast::Program_*,_std::default_delete<punky::ast::Program>_>.
       super__Head_base<0UL,_punky::ast::Program_*,_false>._M_head_impl;
  puVar2 = *(pointer *)((long)&(_Var1._M_head_impl)->m_statements + 8);
  for (puVar3 = *(pointer *)
                 &((_Var1._M_head_impl)->m_statements).
                  super__Vector_base<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>,_std::allocator<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_>_>
      ; puVar3 != puVar2; puVar3 = puVar3 + 1) {
    eval(&local_60,(AstNode *)puVar3->_M_t,env);
    obj::Object::operator=(&local_90,&local_60);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
                         *)&local_60.m_value);
    if (local_90.m_type == Error) break;
    if (local_90.m_type == Return) {
      __any = std::
              get<3ul,std::monostate,int,bool,std::any,std::__cxx11::string,punky::obj::FunctionObject>
                        (&local_90.m_value);
      std::any_cast<punky::obj::Object>(__return_storage_ptr__,__any);
      goto LAB_0010da87;
    }
  }
  obj::Object::Object(__return_storage_ptr__,&local_90);
LAB_0010da87:
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
                       *)&local_90.m_value);
  return __return_storage_ptr__;
}

Assistant:

Object Evaluator::eval_program(env::Environment& env) const
{
    Object result{};
    for (const auto& stmt : m_program->statements())
    {
        result = eval(*stmt, env);

        if (result.m_type == ObjectType::Return)
            return std::any_cast<Object>(std::get<std::any>(result.m_value));

        if (result.m_type == ObjectType::Error)
            return result;
    }
    return result;
}